

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerHLSL::emit_load(CompilerHLSL *this,Instruction *instruction)

{
  uint32_t result_id;
  ID id_00;
  bool bVar1;
  byte bVar2;
  ExecutionModel EVar3;
  uint32_t uVar4;
  uint32_t *puVar5;
  SPIRAccessChain *chain;
  SPIRType *type;
  iterator iVar6;
  SPIRExpression *e;
  SPIRType *type_00;
  char **in_R8;
  uint32_t index;
  uint32_t id;
  uint32_t local_9c;
  string load_expr;
  char *local_78;
  string local_70;
  string local_50;
  
  puVar5 = Compiler::stream((Compiler *)this,instruction);
  uVar4 = *puVar5;
  result_id = puVar5[1];
  id_00.id = puVar5[2];
  id = result_id;
  chain = Compiler::maybe_get<spirv_cross::SPIRAccessChain>((Compiler *)this,id_00.id);
  local_9c = uVar4;
  type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
  if (chain != (SPIRAccessChain *)0x0) {
    if (((type->array).super_VectorView<unsigned_int>.buffer_size != 0) ||
       (type->basetype == Struct)) {
      CompilerGLSL::emit_uninitialized_temporary_expression
                (&this->super_CompilerGLSL,local_9c,result_id);
      CompilerGLSL::to_expression_abi_cxx11_(&load_expr,&this->super_CompilerGLSL,result_id,true);
      read_access_chain(this,(string *)0x0,&load_expr,chain);
      ::std::__cxx11::string::~string((string *)&load_expr);
      CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,(chain->super_IVariant).self.id)
      ;
      return;
    }
    load_expr._M_dataplus._M_p = (pointer)&load_expr.field_2;
    load_expr._M_string_length = 0;
    load_expr.field_2._M_local_buf[0] = '\0';
    ::std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_50);
    read_access_chain(this,&load_expr,&local_70,chain);
    ::std::__cxx11::string::~string((string *)&local_70);
    bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,id_00.id);
    if ((bVar1) &&
       (iVar6 = ::std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&(this->super_CompilerGLSL).super_Compiler.forced_temporaries._M_h,&id),
       iVar6.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0)) {
      bVar2 = 1;
    }
    else {
      CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,(chain->super_IVariant).self.id)
      ;
      bVar2 = 0;
    }
    bVar1 = (bool)(type->columns < 2 & bVar2);
    e = CompilerGLSL::emit_op(&this->super_CompilerGLSL,local_9c,id,&load_expr,bVar1,true);
    e->need_transpose = false;
    Compiler::register_read((Compiler *)this,id,id_00.id,bVar1);
    Compiler::inherit_expression_dependencies((Compiler *)this,id,id_00.id);
    if (bVar1 != false) {
      Compiler::add_implied_read_expression((Compiler *)this,e,(chain->super_IVariant).self.id);
    }
LAB_001b90c2:
    ::std::__cxx11::string::~string((string *)&load_expr);
    return;
  }
  EVar3 = Compiler::get_execution_model((Compiler *)this);
  if ((((EVar3 == ExecutionModelMeshEXT) &&
       (bVar1 = Compiler::has_decoration((Compiler *)this,id_00,BuiltIn), bVar1)) &&
      ((uVar4 = Compiler::get_decoration((Compiler *)this,id_00,BuiltIn), uVar4 == 3 ||
       (uVar4 = Compiler::get_decoration((Compiler *)this,id_00,BuiltIn), uVar4 == 4)))) &&
     (bVar1 = Compiler::is_array((Compiler *)this,type), bVar1)) {
    type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(type->parent_type).id);
    bVar1 = Compiler::is_array((Compiler *)this,type_00);
    if ((!bVar1) &&
       (uVar4 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type), 1 < uVar4)) {
      CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,id_00.id);
      ::std::__cxx11::string::string((string *)&load_expr,"{ ",(allocator *)&local_70);
      uVar4 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type);
      index = 0;
      while (uVar4 != index) {
        CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,id_00.id,true);
        local_78 = CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,index);
        join<std::__cxx11::string,char_const(&)[2],char_const*>
                  (&local_70,(spirv_cross *)&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2fcc03,
                   (char (*) [2])&local_78,in_R8);
        ::std::__cxx11::string::append((string *)&load_expr);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_50);
        index = index + 1;
        if (index < uVar4) {
          ::std::__cxx11::string::append((char *)&load_expr);
        }
      }
      ::std::__cxx11::string::append((char *)&load_expr);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,local_9c,result_id,&load_expr,false,false);
      Compiler::register_read((Compiler *)this,result_id,id_00.id,false);
      Compiler::inherit_expression_dependencies((Compiler *)this,result_id,id_00.id);
      goto LAB_001b90c2;
    }
  }
  CompilerGLSL::emit_instruction(&this->super_CompilerGLSL,instruction);
  return;
}

Assistant:

void CompilerHLSL::emit_load(const Instruction &instruction)
{
	auto ops = stream(instruction);

	uint32_t result_type = ops[0];
	uint32_t id = ops[1];
	uint32_t ptr = ops[2];

	auto *chain = maybe_get<SPIRAccessChain>(ptr);
	if (chain)
	{
		auto &type = get<SPIRType>(result_type);
		bool composite_load = !type.array.empty() || type.basetype == SPIRType::Struct;

		if (composite_load)
		{
			// We cannot make this work in one single expression as we might have nested structures and arrays,
			// so unroll the load to an uninitialized temporary.
			emit_uninitialized_temporary_expression(result_type, id);
			read_access_chain(nullptr, to_expression(id), *chain);
			track_expression_read(chain->self);
		}
		else
		{
			string load_expr;
			read_access_chain(&load_expr, "", *chain);

			bool forward = should_forward(ptr) && forced_temporaries.find(id) == end(forced_temporaries);

			// If we are forwarding this load,
			// don't register the read to access chain here, defer that to when we actually use the expression,
			// using the add_implied_read_expression mechanism.
			if (!forward)
				track_expression_read(chain->self);

			// Do not forward complex load sequences like matrices, structs and arrays.
			if (type.columns > 1)
				forward = false;

			auto &e = emit_op(result_type, id, load_expr, forward, true);
			e.need_transpose = false;
			register_read(id, ptr, forward);
			inherit_expression_dependencies(id, ptr);
			if (forward)
				add_implied_read_expression(e, chain->self);
		}
	}
	else
	{
		// Very special case where we cannot rely on IO lowering.
		// Mesh shader clip/cull arrays ... Cursed.
		auto &res_type = get<SPIRType>(result_type);
		if (get_execution_model() == ExecutionModelMeshEXT &&
		    has_decoration(ptr, DecorationBuiltIn) &&
		    (get_decoration(ptr, DecorationBuiltIn) == BuiltInClipDistance ||
		     get_decoration(ptr, DecorationBuiltIn) == BuiltInCullDistance) &&
		    is_array(res_type) && !is_array(get<SPIRType>(res_type.parent_type)) &&
		    to_array_size_literal(res_type) > 1)
		{
			track_expression_read(ptr);
			string load_expr = "{ ";
			uint32_t num_elements = to_array_size_literal(res_type);
			for (uint32_t i = 0; i < num_elements; i++)
			{
				load_expr += join(to_expression(ptr), ".", index_to_swizzle(i));
				if (i + 1 < num_elements)
					load_expr += ", ";
			}
			load_expr += " }";
			emit_op(result_type, id, load_expr, false);
			register_read(id, ptr, false);
			inherit_expression_dependencies(id, ptr);
		}
		else
		{
			CompilerGLSL::emit_instruction(instruction);
		}
	}
}